

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O2

void duckdb::alp::AlpDecompression<double>::Decompress
               (uint8_t *for_encoded,double *output,idx_t count,uint8_t vector_factor,
               uint8_t vector_exponent,uint16_t exceptions_count,double *exceptions,
               uint16_t *exceptions_positions,uint64_t frame_of_reference,uint8_t bit_width)

{
  idx_t iVar1;
  ulong uVar2;
  AlpEncodingIndices encoding_indices;
  idx_t i_1;
  double dVar3;
  long local_2038 [1025];
  
  switchD_014c69ad::default(local_2038,0,0x2000);
  if (bit_width != '\0') {
    BitpackingPrimitives::UnPackBuffer<unsigned_long>
              ((data_ptr_t)local_2038,for_encoded,count,bit_width,false);
  }
  for (iVar1 = 0; count != iVar1; iVar1 = iVar1 + 1) {
    local_2038[iVar1] = local_2038[iVar1] + frame_of_reference;
  }
  encoding_indices.factor = vector_factor;
  encoding_indices.exponent = vector_exponent;
  for (iVar1 = 0; count != iVar1; iVar1 = iVar1 + 1) {
    dVar3 = AlpCompression<double,_true>::DecodeValue(local_2038[iVar1],encoding_indices);
    output[iVar1] = dVar3;
  }
  for (uVar2 = 0; exceptions_count != uVar2; uVar2 = uVar2 + 1) {
    output[exceptions_positions[uVar2]] = exceptions[uVar2];
  }
  return;
}

Assistant:

static void Decompress(uint8_t *for_encoded, T *output, idx_t count, uint8_t vector_factor, uint8_t vector_exponent,
	                       uint16_t exceptions_count, T *exceptions, const uint16_t *exceptions_positions,
	                       uint64_t frame_of_reference, uint8_t bit_width) {
		AlpEncodingIndices encoding_indices = {vector_exponent, vector_factor};

		// Bit Unpacking
		uint8_t for_decoded[AlpConstants::ALP_VECTOR_SIZE * 8] = {0};
		if (bit_width > 0) {
			BitpackingPrimitives::UnPackBuffer<uint64_t>(for_decoded, for_encoded, count, bit_width);
		}
		auto *encoded_integers = reinterpret_cast<uint64_t *>(data_ptr_cast(for_decoded));

		// unFOR
		for (idx_t i = 0; i < count; i++) {
			encoded_integers[i] += frame_of_reference;
		}

		// Decoding
		for (idx_t i = 0; i < count; i++) {
			auto encoded_integer = static_cast<int64_t>(encoded_integers[i]);
			output[i] = alp::AlpCompression<T, true>::DecodeValue(encoded_integer, encoding_indices);
		}

		// Exceptions Patching
		for (idx_t i = 0; i < exceptions_count; i++) {
			output[exceptions_positions[i]] = static_cast<T>(exceptions[i]);
		}
	}